

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part.c
# Opt level: O2

exr_result_t exr_add_part(exr_context_t ctxt,char *partname,exr_storage_t type,int *new_index)

{
  exr_result_t eVar1;
  size_t sVar2;
  char *__s;
  _internal_exr_part *part;
  int32_t local_3c;
  long local_38;
  
  part = (_internal_exr_part *)0x0;
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  if (*ctxt != (_priv_exr_context_t)0x1) {
    eVar1 = (**(code **)(ctxt + 0x38))(ctxt,8);
    return eVar1;
  }
  eVar1 = internal_exr_add_part((_internal_exr_context *)ctxt,&part,new_index);
  if (eVar1 != 0) {
    return eVar1;
  }
  part->storage_mode = type;
  if (EXR_STORAGE_DEEP_TILED < type) {
    internal_exr_revert_add_part((_internal_exr_context *)ctxt,&part,new_index);
    eVar1 = (**(code **)(ctxt + 0x48))(ctxt,3,"Invalid storage type %d for new part",type);
    return eVar1;
  }
  local_3c = *(int32_t *)(&DAT_00306868 + (ulong)type * 4);
  local_38 = (long)*(int *)(&DAT_00306700 + (ulong)type * 4);
  eVar1 = exr_attr_list_add_static_name
                    (ctxt,&part->attributes,"type",EXR_ATTR_STRING,0,(uint8_t **)0x0,&part->type);
  if ((eVar1 == 0) &&
     (eVar1 = exr_attr_string_init_static_with_length
                        (ctxt,(part->type->field_6).string,&DAT_00306700 + local_38,local_3c),
     eVar1 == 0)) {
    __s = "";
    if (partname != (char *)0x0) {
      __s = partname;
    }
    if (*__s != '\0') {
      sVar2 = strlen(__s);
      if (0x7ffffffe < sVar2) {
        internal_exr_revert_add_part((_internal_exr_context *)ctxt,&part,new_index);
        eVar1 = (**(code **)(ctxt + 0x48))
                          (ctxt,0xe,"Part name \'%s\': Invalid name length %lu",__s,sVar2);
        return eVar1;
      }
      eVar1 = exr_attr_list_add_static_name
                        (ctxt,&part->attributes,"name",EXR_ATTR_STRING,0,(uint8_t **)0x0,&part->name
                        );
      if ((eVar1 != 0) ||
         (eVar1 = exr_attr_string_create_with_length
                            (ctxt,(part->name->field_6).string,__s,(int32_t)sVar2), eVar1 != 0))
      goto LAB_00111209;
    }
    if (EXR_STORAGE_TILED < type) {
      eVar1 = exr_attr_list_add_static_name
                        (ctxt,&part->attributes,"version",EXR_ATTR_INT,0,(uint8_t **)0x0,
                         &part->version);
      if (eVar1 != 0) {
        ctxt[4] = (_priv_exr_context_t)0x1;
        goto LAB_00111209;
      }
      (part->version->field_6).f = 1.4013e-45;
      ctxt[4] = (_priv_exr_context_t)0x1;
    }
    if (1 < *(int *)(ctxt + 0xc4)) {
      ctxt[5] = (_priv_exr_context_t)0x1;
    }
    if ((ctxt[4] == (_priv_exr_context_t)0x0) &&
       (type == EXR_STORAGE_TILED && *(int *)(ctxt + 0xc4) == 1)) {
      ctxt[3] = (_priv_exr_context_t)0x1;
    }
    else {
      ctxt[3] = (_priv_exr_context_t)0x0;
    }
    eVar1 = 0;
  }
  else {
LAB_00111209:
    internal_exr_revert_add_part((_internal_exr_context *)ctxt,&part,new_index);
  }
  return eVar1;
}

Assistant:

exr_result_t
exr_add_part (
    exr_context_t ctxt,
    const char*   partname,
    exr_storage_t type,
    int*          new_index)
{
    exr_result_t rv;
    int32_t      attrsz  = -1;
    const char*  typestr = NULL;

    struct _internal_exr_part* part = NULL;

    EXR_PROMOTE_LOCKED_CONTEXT_OR_ERROR (ctxt);

    if (pctxt->mode != EXR_CONTEXT_WRITE)
        return EXR_UNLOCK_AND_RETURN_PCTXT (
            pctxt->standard_error (pctxt, EXR_ERR_NOT_OPEN_WRITE));

    rv = internal_exr_add_part (pctxt, &part, new_index);
    if (rv != EXR_ERR_SUCCESS) return EXR_UNLOCK_AND_RETURN_PCTXT (rv);

    part->storage_mode = type;
    switch (type)
    {
        case EXR_STORAGE_SCANLINE:
            typestr = "scanlineimage";
            attrsz  = 13;
            break;
        case EXR_STORAGE_TILED:
            typestr = "tiledimage";
            attrsz  = 10;
            break;
        case EXR_STORAGE_DEEP_SCANLINE:
            typestr = "deepscanline";
            attrsz  = 12;
            break;
        case EXR_STORAGE_DEEP_TILED:
            typestr = "deeptile";
            attrsz  = 8;
            break;
        case EXR_STORAGE_LAST_TYPE:
        default:
            internal_exr_revert_add_part (pctxt, &part, new_index);
            return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
                pctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "Invalid storage type %d for new part",
                (int) type));
    }

    rv = exr_attr_list_add_static_name (
        ctxt,
        &(part->attributes),
        EXR_REQ_TYPE_STR,
        EXR_ATTR_STRING,
        0,
        NULL,
        &(part->type));

    if (rv != EXR_ERR_SUCCESS)
    {
        internal_exr_revert_add_part (pctxt, &part, new_index);
        return EXR_UNLOCK_AND_RETURN_PCTXT (rv);
    }

    rv = exr_attr_string_init_static_with_length (
        ctxt, part->type->string, typestr, attrsz);

    if (rv != EXR_ERR_SUCCESS)
    {
        internal_exr_revert_add_part (pctxt, &part, new_index);
        return EXR_UNLOCK_AND_RETURN_PCTXT (rv);
    }

    /* make sure we put in SOME sort of partname */
    if (!partname) partname = "";
    if (partname && partname[0] != '\0')
    {
        size_t pnamelen = strlen (partname);
        if (pnamelen >= INT32_MAX)
        {
            internal_exr_revert_add_part (pctxt, &part, new_index);
            return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
                pctxt,
                EXR_ERR_INVALID_ATTR,
                "Part name '%s': Invalid name length %" PRIu64,
                partname,
                (uint64_t) pnamelen));
        }

        rv = exr_attr_list_add_static_name (
            ctxt,
            &(part->attributes),
            EXR_REQ_NAME_STR,
            EXR_ATTR_STRING,
            0,
            NULL,
            &(part->name));

        if (rv == EXR_ERR_SUCCESS)
            rv = exr_attr_string_create_with_length (
                ctxt, part->name->string, partname, (int32_t) pnamelen);
    }

    if (rv == EXR_ERR_SUCCESS &&
        (type == EXR_STORAGE_DEEP_TILED || type == EXR_STORAGE_DEEP_SCANLINE))
    {
        rv = exr_attr_list_add_static_name (
            ctxt,
            &(part->attributes),
            EXR_REQ_VERSION_STR,
            EXR_ATTR_INT,
            0,
            NULL,
            &(part->version));
        if (rv == EXR_ERR_SUCCESS) part->version->i = 1;
        pctxt->has_nonimage_data = 1;
    }

    if (rv == EXR_ERR_SUCCESS)
    {
        if (pctxt->num_parts > 1) pctxt->is_multipart = 1;

        if (!pctxt->has_nonimage_data && pctxt->num_parts == 1 &&
            type == EXR_STORAGE_TILED)
            pctxt->is_singlepart_tiled = 1;
        else
            pctxt->is_singlepart_tiled = 0;
    }
    else
        internal_exr_revert_add_part (pctxt, &part, new_index);

    return EXR_UNLOCK_AND_RETURN_PCTXT (rv);
}